

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

void process_new_connection(mg_connection *conn)

{
  int iVar1;
  bool bVar2;
  int local_a4;
  int local_94;
  int uri_type;
  int reqerr;
  char *hostend;
  char ebuf [100];
  int discard_len;
  int keep_alive;
  mg_request_info *ri;
  mg_connection *conn_local;
  
  do {
    iVar1 = get_request(conn,(char *)&hostend,100,&local_94);
    if (iVar1 == 0) {
      if (0 < local_94) {
        mg_send_http_error(conn,local_94,"%s",&hostend);
      }
    }
    else {
      iVar1 = strcmp((conn->request_info).http_version,"1.0");
      if ((iVar1 != 0) && (iVar1 = strcmp((conn->request_info).http_version,"1.1"), iVar1 != 0)) {
        mg_snprintf(conn,(int *)0x0,(char *)&hostend,100,"Bad HTTP version: [%s]",
                    (conn->request_info).http_version);
        mg_send_http_error(conn,0x1f9,"%s",&hostend);
      }
    }
    if ((char)hostend == '\0') {
      iVar1 = get_uri_type((conn->request_info).request_uri);
      if (iVar1 == 1) {
        (conn->request_info).local_uri_raw = (char *)0x0;
      }
      else if (iVar1 == 2) {
        (conn->request_info).local_uri_raw = (conn->request_info).request_uri;
      }
      else if (iVar1 - 3U < 2) {
        _uri_type = get_rel_url_at_current_server((conn->request_info).request_uri,conn);
        if (_uri_type == (char *)0x0) {
          (conn->request_info).local_uri_raw = (char *)0x0;
        }
        else {
          (conn->request_info).local_uri_raw = _uri_type;
        }
      }
      else {
        mg_snprintf(conn,(int *)0x0,(char *)&hostend,100,"Invalid URI");
        mg_send_http_error(conn,400,"%s",&hostend);
        (conn->request_info).local_uri_raw = (char *)0x0;
      }
      (conn->request_info).local_uri = (conn->request_info).local_uri_raw;
    }
    if ((char)hostend == '\0') {
      iVar1 = should_switch_to_protocol(conn);
      conn->protocol_type = iVar1;
      if (conn->protocol_type == 2) {
        conn->protocol_type = 0;
      }
    }
    else {
      conn->protocol_type = -1;
    }
    if ((char)hostend == '\0') {
      if ((conn->request_info).local_uri == (char *)0x0) {
        conn->must_close = 1;
      }
      else {
        handle_request_stat_log(conn);
      }
    }
    else {
      conn->must_close = 1;
    }
    free_buffered_response_header_list(conn);
    if ((conn->request_info).remote_user != (char *)0x0) {
      mg_free((conn->request_info).remote_user);
      (conn->request_info).remote_user = (char *)0x0;
    }
    bVar2 = false;
    if (conn->phys_ctx->stop_flag == 0) {
      iVar1 = should_keep_alive(conn);
      bVar2 = false;
      if ((((iVar1 != 0) && (bVar2 = false, -1 < conn->content_len)) &&
          (bVar2 = false, 0 < conn->request_len)) &&
         ((conn->is_chunked == 4 ||
          ((bVar2 = false, conn->is_chunked == 0 &&
           ((conn->consumed_content == conn->content_len ||
            (bVar2 = false, (long)conn->request_len + conn->content_len <= (long)conn->data_len)))))
          ))) {
        bVar2 = conn->protocol_type == 0;
      }
    }
    if (bVar2) {
      if ((long)conn->request_len + conn->content_len < (long)conn->data_len) {
        local_a4 = conn->request_len + (int)conn->content_len;
      }
      else {
        local_a4 = conn->data_len;
      }
      ebuf[0x60] = (undefined1)local_a4;
      ebuf[0x61] = local_a4._1_1_;
      ebuf[0x62] = local_a4._2_1_;
      ebuf[99] = local_a4._3_1_;
      conn->data_len = conn->data_len - local_a4;
      if (0 < conn->data_len) {
        memmove(conn->buf,conn->buf + local_a4,(long)conn->data_len);
      }
    }
  } while (((-1 < conn->data_len) && (conn->data_len <= conn->buf_size)) &&
          (conn->handled_requests = conn->handled_requests + 1, bVar2));
  close_connection(conn);
  return;
}

Assistant:

static void
process_new_connection(struct mg_connection *conn)
{
	struct mg_request_info *ri = &conn->request_info;
	int keep_alive, discard_len;
	char ebuf[100];
	const char *hostend;
	int reqerr, uri_type;

#if defined(USE_SERVER_STATS)
	ptrdiff_t mcon = mg_atomic_inc(&(conn->phys_ctx->active_connections));
	mg_atomic_add(&(conn->phys_ctx->total_connections), 1);
	mg_atomic_max(&(conn->phys_ctx->max_active_connections), mcon);
#endif

	DEBUG_TRACE("Start processing connection from %s",
	            conn->request_info.remote_addr);

	/* Loop over multiple requests sent using the same connection
	 * (while "keep alive"). */
	do {
		DEBUG_TRACE("calling get_request (%i times for this connection)",
		            conn->handled_requests + 1);

#if defined(USE_SERVER_STATS)
		conn->conn_state = 3; /* ready */
#endif

		if (!get_request(conn, ebuf, sizeof(ebuf), &reqerr)) {
			/* The request sent by the client could not be understood by
			 * the server, or it was incomplete or a timeout. Send an
			 * error message and close the connection. */
			if (reqerr > 0) {
				DEBUG_ASSERT(ebuf[0] != '\0');
				mg_send_http_error(conn, reqerr, "%s", ebuf);
			}

		} else if (strcmp(ri->http_version, "1.0")
		           && strcmp(ri->http_version, "1.1")) {
			/* HTTP/2 is not allowed here */
			mg_snprintf(conn,
			            NULL, /* No truncation check for ebuf */
			            ebuf,
			            sizeof(ebuf),
			            "Bad HTTP version: [%s]",
			            ri->http_version);
			mg_send_http_error(conn, 505, "%s", ebuf);
		}

		if (ebuf[0] == '\0') {
			uri_type = get_uri_type(conn->request_info.request_uri);
			switch (uri_type) {
			case 1:
				/* Asterisk */
				conn->request_info.local_uri_raw = 0;
				/* TODO: Deal with '*'. */
				break;
			case 2:
				/* relative uri */
				conn->request_info.local_uri_raw =
				    conn->request_info.request_uri;
				break;
			case 3:
			case 4:
				/* absolute uri (with/without port) */
				hostend = get_rel_url_at_current_server(
				    conn->request_info.request_uri, conn);
				if (hostend) {
					conn->request_info.local_uri_raw = hostend;
				} else {
					conn->request_info.local_uri_raw = NULL;
				}
				break;
			default:
				mg_snprintf(conn,
				            NULL, /* No truncation check for ebuf */
				            ebuf,
				            sizeof(ebuf),
				            "Invalid URI");
				mg_send_http_error(conn, 400, "%s", ebuf);
				conn->request_info.local_uri_raw = NULL;
				break;
			}
			conn->request_info.local_uri =
			    (char *)conn->request_info.local_uri_raw;
		}

		if (ebuf[0] != '\0') {
			conn->protocol_type = -1;

		} else {
			/* HTTP/1 allows protocol upgrade */
			conn->protocol_type = should_switch_to_protocol(conn);

			if (conn->protocol_type == PROTOCOL_TYPE_HTTP2) {
				/* This will occur, if a HTTP/1.1 request should be upgraded
				 * to HTTP/2 - but not if HTTP/2 is negotiated using ALPN.
				 * Since most (all?) major browsers only support HTTP/2 using
				 * ALPN, this is hard to test and very low priority.
				 * Deactivate it (at least for now).
				 */
				conn->protocol_type = PROTOCOL_TYPE_HTTP1;
			}
		}

		DEBUG_TRACE("http: %s, error: %s",
		            (ri->http_version ? ri->http_version : "none"),
		            (ebuf[0] ? ebuf : "none"));

		if (ebuf[0] == '\0') {
			if (conn->request_info.local_uri) {

				/* handle request to local server */
				handle_request_stat_log(conn);

			} else {
				/* TODO: handle non-local request (PROXY) */
				conn->must_close = 1;
			}
		} else {
			conn->must_close = 1;
		}

		/* Response complete. Free header buffer */
		free_buffered_response_header_list(conn);

		if (ri->remote_user != NULL) {
			mg_free((void *)ri->remote_user);
			/* Important! When having connections with and without auth
			 * would cause double free and then crash */
			ri->remote_user = NULL;
		}

		/* NOTE(lsm): order is important here. should_keep_alive() call
		 * is using parsed request, which will be invalid after
		 * memmove's below.
		 * Therefore, memorize should_keep_alive() result now for later
		 * use in loop exit condition. */
		/* Enable it only if this request is completely discardable. */
		keep_alive = STOP_FLAG_IS_ZERO(&conn->phys_ctx->stop_flag)
		             && should_keep_alive(conn) && (conn->content_len >= 0)
		             && (conn->request_len > 0)
		             && ((conn->is_chunked == 4)
		                 || (!conn->is_chunked
		                     && ((conn->consumed_content == conn->content_len)
		                         || ((conn->request_len + conn->content_len)
		                             <= conn->data_len))))
		             && (conn->protocol_type == PROTOCOL_TYPE_HTTP1);

		if (keep_alive) {
			/* Discard all buffered data for this request */
			discard_len =
			    ((conn->request_len + conn->content_len) < conn->data_len)
			        ? (int)(conn->request_len + conn->content_len)
			        : conn->data_len;
			conn->data_len -= discard_len;

			if (conn->data_len > 0) {
				DEBUG_TRACE("discard_len = %d", discard_len);
				memmove(conn->buf,
				        conn->buf + discard_len,
				        (size_t)conn->data_len);
			}
		}

		DEBUG_ASSERT(conn->data_len >= 0);
		DEBUG_ASSERT(conn->data_len <= conn->buf_size);

		if ((conn->data_len < 0) || (conn->data_len > conn->buf_size)) {
			DEBUG_TRACE("internal error: data_len = %li, buf_size = %li",
			            (long int)conn->data_len,
			            (long int)conn->buf_size);
			break;
		}
		conn->handled_requests++;
	} while (keep_alive);

	DEBUG_TRACE("Done processing connection from %s (%f sec)",
	            conn->request_info.remote_addr,
	            difftime(time(NULL), conn->conn_birth_time));

	close_connection(conn);

#if defined(USE_SERVER_STATS)
	mg_atomic_add(&(conn->phys_ctx->total_requests), conn->handled_requests);
	mg_atomic_dec(&(conn->phys_ctx->active_connections));
#endif
}